

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommDummy.cpp
# Opt level: O2

void adios2::helper::anon_unknown_8::CommDummyError(string *msg)

{
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"Helper",&local_a9);
  std::__cxx11::string::string((string *)&local_48,"adiosCommDummy",&local_aa);
  std::__cxx11::string::string((string *)&local_68,"CommDummyError",&local_ab);
  std::operator+(&local_a8,"CommDummy: a function returned error code \'",msg);
  std::operator+(&local_88,&local_a8,"\'. Aborting!");
  Log(&local_28,&local_48,&local_68,&local_88,FATALERROR);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  abort();
}

Assistant:

void CommDummyError(const std::string &msg)
{
    helper::Log("Helper", "adiosCommDummy", "CommDummyError",
                "CommDummy: a function returned error code '" + msg + "'. Aborting!",
                helper::FATALERROR);
    std::abort();
}